

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNErrCode SUNSparseMatrix_ToCSR(SUNMatrix A,SUNMatrix *Bout)

{
  sunindextype *psVar1;
  SUNMatrix B;
  
  psVar1 = (sunindextype *)A->content;
  B = SUNSparseMatrix(*psVar1,psVar1[1],psVar1[2],1,A->sunctx);
  *Bout = B;
  format_convert(A,B);
  return 0;
}

Assistant:

SUNErrCode SUNSparseMatrix_ToCSR(const SUNMatrix A, SUNMatrix* Bout)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SM_SPARSETYPE_S(A) == CSC_MAT, SUN_ERR_ARG_OUTOFRANGE);

  *Bout = SUNSparseMatrix(SM_ROWS_S(A), SM_COLUMNS_S(A), SM_NNZ_S(A), CSR_MAT,
                          A->sunctx);
  SUNCheckLastErr();
  SUNCheckCall(format_convert(A, *Bout));
  return SUN_SUCCESS;
}